

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionInstruction
          (ValidationState_t *_,Instruction *inst,uint32_t version)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  NonSemanticClspvReflectionInstructions NVar4;
  uint uVar5;
  uint uVar6;
  Instruction *inst_00;
  long lVar7;
  spv_result_t sVar8;
  char *pcVar9;
  string local_228;
  DiagnosticStream local_208;
  
  bVar3 = ValidationState_t::IsVoidType(_,(inst->inst_).type_id);
  if (bVar3) {
    NVar4 = Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(inst,3);
    uVar5 = NVar4 - NonSemanticClspvReflectionKernel;
    uVar6 = 0;
    if (uVar5 < 0x28) {
      uVar6 = *(uint *)(&DAT_007c0ed0 + (ulong)uVar5 * 4);
    }
    if (uVar6 <= version) {
      sVar8 = SPV_SUCCESS;
      switch(uVar5) {
      case 0:
        sVar8 = ValidateClspvReflectionKernel(_,inst,version);
        return sVar8;
      case 1:
        sVar8 = ValidateClspvReflectionArgumentInfo(_,inst);
        return sVar8;
      case 2:
      case 3:
      case 7:
      case 8:
      case 9:
      case 0x21:
      case 0x22:
        psVar1 = (inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        psVar2 = (inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar8 = ValidateKernelDecl(_,inst);
        if (sVar8 != SPV_SUCCESS) {
          return sVar8;
        }
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,5);
        bVar3 = IsUint32Constant(_,uVar6);
        if (bVar3) {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,6);
          bVar3 = IsUint32Constant(_,uVar6);
          if (!bVar3) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar9 = "DescriptorSet must be a 32-bit unsigned integer OpConstant";
            lVar7 = 0x3a;
            break;
          }
          uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,7);
          bVar3 = IsUint32Constant(_,uVar6);
          if (bVar3) {
            if (((long)psVar1 - (long)psVar2 == 0x90) &&
               (sVar8 = ValidateArgInfo(_,inst,8), sVar8 != SPV_SUCCESS)) {
              return sVar8;
            }
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar9 = "Binding must be a 32-bit unsigned integer OpConstant";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar9 = "Ordinal must be a 32-bit unsigned integer OpConstant";
        }
        lVar7 = 0x34;
        break;
      case 4:
      case 5:
      case 0x1a:
        sVar8 = ValidateClspvReflectionArgumentOffsetBuffer(_,inst);
        return sVar8;
      case 6:
      case 0x19:
        sVar8 = ValidateClspvReflectionArgumentPushConstant(_,inst);
        return sVar8;
      case 10:
        sVar8 = ValidateClspvReflectionArgumentWorkgroup(_,inst);
        return sVar8;
      case 0xb:
      case 0xc:
        sVar8 = ValidateClspvReflectionSpecConstantTriple(_,inst);
        return sVar8;
      case 0xd:
        sVar8 = ValidateClspvReflectionSpecConstantWorkDim(_,inst);
        return sVar8;
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,4);
        bVar3 = IsUint32Constant(_,uVar6);
        if (bVar3) {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,5);
          bVar3 = IsUint32Constant(_,uVar6);
          if (bVar3) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar9 = "Size must be a 32-bit unsigned integer OpConstant";
          lVar7 = 0x31;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar9 = "Offset must be a 32-bit unsigned integer OpConstant";
          lVar7 = 0x33;
        }
        break;
      case 0x14:
      case 0x15:
      case 0x1b:
        sVar8 = ValidateClspvReflectionInitializedData(_,inst);
        return sVar8;
      case 0x16:
        sVar8 = ValidateClspvReflectionSampler(_,inst);
        return sVar8;
      case 0x17:
        sVar8 = ValidateClspvReflectionPropertyRequiredWorkgroupSize(_,inst);
        return sVar8;
      case 0x18:
        sVar8 = ValidateClspvReflectionSubgroupMaxSize(_,inst);
        return sVar8;
      case 0x1c:
        sVar8 = ValidateClspvReflectionPointerRelocation(_,inst);
        return sVar8;
      case 0x1d:
      case 0x1e:
        sVar8 = ValidateClspvReflectionImageMetadataPushConstant(_,inst);
        return sVar8;
      case 0x1f:
      case 0x20:
        sVar8 = ValidateClspvReflectionImageMetadataUniform(_,inst);
        return sVar8;
      case 0x23:
      case 0x24:
        sVar8 = ValidateClspvReflectionPushConstantData(_,inst);
        return sVar8;
      case 0x25:
        sVar8 = ValidateClspvReflectionPrintfInfo(_,inst);
        return sVar8;
      case 0x26:
        sVar8 = ValidateClspvReflectionPrintfStorageBuffer(_,inst);
        return sVar8;
      case 0x27:
        sVar8 = ValidateClspvReflectionPrintfPushConstant(_,inst);
        return sVar8;
      default:
        goto switchD_0067fd1a_default;
      }
      goto LAB_0067fcda;
    }
    inst_00 = inst;
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
              (&local_228,(_anonymous_namespace_ *)_,(ValidationState_t *)inst,inst_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," requires version ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,", but parsed version is ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    sVar8 = local_208.error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar9 = "Return Type must be OpTypeVoid";
    lVar7 = 0x1e;
LAB_0067fcda:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar9,lVar7);
    sVar8 = local_208.error_;
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
switchD_0067fd1a_default:
  return sVar8;
}

Assistant:

spv_result_t ValidateClspvReflectionInstruction(ValidationState_t& _,
                                                const Instruction* inst,
                                                uint32_t version) {
  if (!_.IsVoidType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Return Type must be OpTypeVoid";
  }

  uint32_t required_version = 0;
  const auto ext_inst =
      inst->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
    case NonSemanticClspvReflectionArgumentInfo:
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentWorkgroup:
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
    case NonSemanticClspvReflectionSpecConstantWorkDim:
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionLiteralSampler:
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      required_version = 1;
      break;
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      required_version = 2;
      break;
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
    case NonSemanticClspvReflectionArgumentPointerUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      required_version = 3;
      break;
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      required_version = 4;
      break;
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
    case NonSemanticClspvReflectionPrintfInfo:
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      required_version = 5;
      break;
    default:
      break;
  }
  if (version < required_version) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << ReflectionInstructionName(_, inst) << " requires version "
           << required_version << ", but parsed version is " << version;
  }

  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
      return ValidateClspvReflectionKernel(_, inst, version);
    case NonSemanticClspvReflectionArgumentInfo:
      return ValidateClspvReflectionArgumentInfo(_, inst);
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      return ValidateClspvReflectionArgumentBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPointerUniform:
      return ValidateClspvReflectionArgumentOffsetBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
      return ValidateClspvReflectionArgumentPushConstant(_, inst);
    case NonSemanticClspvReflectionArgumentWorkgroup:
      return ValidateClspvReflectionArgumentWorkgroup(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
      return ValidateClspvReflectionSpecConstantTriple(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkDim:
      return ValidateClspvReflectionSpecConstantWorkDim(_, inst);
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
      return ValidateClspvReflectionPushConstant(_, inst);
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
      return ValidateClspvReflectionInitializedData(_, inst);
    case NonSemanticClspvReflectionLiteralSampler:
      return ValidateClspvReflectionSampler(_, inst);
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      return ValidateClspvReflectionPropertyRequiredWorkgroupSize(_, inst);
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      return ValidateClspvReflectionSubgroupMaxSize(_, inst);
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
      return ValidateClspvReflectionPointerRelocation(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
      return ValidateClspvReflectionImageMetadataPushConstant(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      return ValidateClspvReflectionImageMetadataUniform(_, inst);
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
      return ValidateClspvReflectionPushConstantData(_, inst);
    case NonSemanticClspvReflectionPrintfInfo:
      return ValidateClspvReflectionPrintfInfo(_, inst);
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
      return ValidateClspvReflectionPrintfStorageBuffer(_, inst);
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      return ValidateClspvReflectionPrintfPushConstant(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}